

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
          (QMovableArrayOps<QItemSelectionRange> *this,qsizetype i,QItemSelectionRange *args)

{
  qsizetype *pqVar1;
  QItemSelectionRange **ppQVar2;
  Data *pDVar3;
  long lVar4;
  QItemSelectionRange *pQVar5;
  QPersistentModelIndexData *pQVar6;
  QPersistentModelIndex QVar7;
  QPersistentModelIndex QVar8;
  long in_FS_OFFSET;
  bool bVar9;
  Inserter local_70;
  QPersistentModelIndex local_48;
  QPersistentModelIndex aQStack_40 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QItemSelectionRange>).
           super_QArrayDataPointer<QItemSelectionRange>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004736ef:
    local_48.d = (args->tl).d;
    aQStack_40[0].d = (args->br).d;
    (args->tl).d = (QPersistentModelIndexData *)0x0;
    (args->br).d = (QPersistentModelIndexData *)0x0;
    bVar9 = (this->super_QGenericArrayOps<QItemSelectionRange>).
            super_QArrayDataPointer<QItemSelectionRange>.size != 0;
    QArrayDataPointer<QItemSelectionRange>::detachAndGrow
              ((QArrayDataPointer<QItemSelectionRange> *)this,(uint)(i == 0 && bVar9),1,
               (QItemSelectionRange **)0x0,(QArrayDataPointer<QItemSelectionRange> *)0x0);
    QVar8.d = aQStack_40[0].d;
    QVar7.d = local_48.d;
    if (i == 0 && bVar9) {
      pQVar5 = (this->super_QGenericArrayOps<QItemSelectionRange>).
               super_QArrayDataPointer<QItemSelectionRange>.ptr;
      local_48.d = (QPersistentModelIndexData *)0x0;
      pQVar5[-1].tl.d = QVar7.d;
      aQStack_40[0].d = (QPersistentModelIndexData *)0x0;
      pQVar5[-1].br.d = QVar8.d;
      (this->super_QGenericArrayOps<QItemSelectionRange>).
      super_QArrayDataPointer<QItemSelectionRange>.ptr = pQVar5 + -1;
      pqVar1 = &(this->super_QGenericArrayOps<QItemSelectionRange>).
                super_QArrayDataPointer<QItemSelectionRange>.size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_70.displaceTo =
           (this->super_QGenericArrayOps<QItemSelectionRange>).
           super_QArrayDataPointer<QItemSelectionRange>.ptr;
      local_70.displaceFrom = local_70.displaceTo + i;
      local_70.displaceTo = local_70.displaceTo + i + 1;
      local_70.nInserts = 1;
      local_70.bytes =
           ((this->super_QGenericArrayOps<QItemSelectionRange>).
            super_QArrayDataPointer<QItemSelectionRange>.size - i) * 0x10;
      local_70.data = (QArrayDataPointer<QItemSelectionRange> *)this;
      memmove(local_70.displaceTo,local_70.displaceFrom,local_70.bytes);
      QVar8.d = aQStack_40[0].d;
      QVar7.d = local_48.d;
      local_48.d = (QPersistentModelIndexData *)0x0;
      ((local_70.displaceFrom)->tl).d = QVar7.d;
      aQStack_40[0].d = (QPersistentModelIndexData *)0x0;
      ((local_70.displaceFrom)->br).d = QVar8.d;
      local_70.displaceFrom = local_70.displaceFrom + 1;
      Inserter::~Inserter(&local_70);
    }
    QPersistentModelIndex::~QPersistentModelIndex(aQStack_40);
    QPersistentModelIndex::~QPersistentModelIndex(&local_48);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QItemSelectionRange>).
            super_QArrayDataPointer<QItemSelectionRange>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QItemSelectionRange>).
                      super_QArrayDataPointer<QItemSelectionRange>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) +
        lVar4)) {
      pQVar5 = (this->super_QGenericArrayOps<QItemSelectionRange>).
               super_QArrayDataPointer<QItemSelectionRange>.ptr;
      pQVar6 = (args->tl).d;
      (args->tl).d = (QPersistentModelIndexData *)0x0;
      pQVar5[lVar4].tl.d = pQVar6;
      pQVar6 = (args->br).d;
      (args->br).d = (QPersistentModelIndexData *)0x0;
      pQVar5[lVar4].br.d = pQVar6;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QItemSelectionRange *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QItemSelectionRange>).
          super_QArrayDataPointer<QItemSelectionRange>.ptr)) goto LAB_004736ef;
      pQVar5 = (this->super_QGenericArrayOps<QItemSelectionRange>).
               super_QArrayDataPointer<QItemSelectionRange>.ptr;
      pQVar6 = (args->tl).d;
      (args->tl).d = (QPersistentModelIndexData *)0x0;
      pQVar5[-1].tl.d = pQVar6;
      pQVar6 = (args->br).d;
      (args->br).d = (QPersistentModelIndexData *)0x0;
      pQVar5[-1].br.d = pQVar6;
      ppQVar2 = &(this->super_QGenericArrayOps<QItemSelectionRange>).
                 super_QArrayDataPointer<QItemSelectionRange>.ptr;
      *ppQVar2 = *ppQVar2 + -1;
    }
    (this->super_QGenericArrayOps<QItemSelectionRange>).super_QArrayDataPointer<QItemSelectionRange>
    .size = lVar4 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }